

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::RsElseClauseSyntax::getChild(RsElseClauseSyntax *this,size_t index)

{
  Token token;
  long in_RDX;
  Info *in_RSI;
  TokenOrSyntax *in_RDI;
  SyntaxNode *in_stack_ffffffffffffffb8;
  TokenOrSyntax *pTVar1;
  
  if (in_RDX == 0) {
    token.info = in_RSI;
    token._0_8_ = in_RDI;
    TokenOrSyntax::TokenOrSyntax(in_RDI,token);
  }
  else if (in_RDX == 1) {
    pTVar1 = in_RDI;
    not_null<slang::syntax::RsProdItemSyntax_*>::get
              ((not_null<slang::syntax::RsProdItemSyntax_*> *)&in_RSI[2].location);
    TokenOrSyntax::TokenOrSyntax(in_RDI,in_stack_ffffffffffffffb8);
    in_RDI = pTVar1;
  }
  else {
    TokenOrSyntax::TokenOrSyntax((TokenOrSyntax *)in_RSI,in_RDI);
  }
  return in_RDI;
}

Assistant:

TokenOrSyntax RsElseClauseSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return keyword;
        case 1: return item.get();
        default: return nullptr;
    }
}